

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
calculator::UnaryFunctionException::~UnaryFunctionException(UnaryFunctionException *this)

{
  SyntaxError::~SyntaxError((SyntaxError *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

UnaryFunctionException(const std::string& functionname) {
        error_msg = "Error: unary function [" + functionname +
                    "] must have an operator number ";
    }